

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_decals.cpp
# Opt level: O0

void __thiscall ON_Decal::CImpl::SetMapToInside(CImpl *this,bool b)

{
  ON_XMLVariant local_110;
  uint local_18;
  undefined1 local_11;
  int i;
  bool b_local;
  CImpl *this_local;
  
  local_18 = (uint)b;
  if ((this->_cache).map_to_inside != local_18) {
    (this->_cache).map_to_inside = local_18;
    local_11 = b;
    _i = this;
    ::ON_XMLVariant::ON_XMLVariant(&local_110,b);
    SetParameter(this,L"map-to-inside-on",&local_110);
    ::ON_XMLVariant::~ON_XMLVariant(&local_110);
  }
  return;
}

Assistant:

void ON_Decal::CImpl::SetMapToInside(bool b)
{
  const int i = b ? 1 : 0;
  if (_cache.map_to_inside != i)
  {
    _cache.map_to_inside = i;
    SetParameter(ON_RDK_DECAL_MAP_TO_INSIDE_ON, b);
  }
}